

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.cpp
# Opt level: O0

ExecutionResult * __thiscall
SchemeSpecialForm::execute
          (ExecutionResult *__return_storage_ptr__,SchemeSpecialForm *this,
          list<std::shared_ptr<ASTNode>,_std::allocator<std::shared_ptr<ASTNode>_>_> *l,
          Context *context)

{
  function<ExecutionResult_(const_std::__cxx11::list<std::shared_ptr<ASTNode>,_std::allocator<std::shared_ptr<ASTNode>_>_>_&,_const_Context_&)>
  local_48;
  Context *local_28;
  Context *context_local;
  list<std::shared_ptr<ASTNode>,_std::allocator<std::shared_ptr<ASTNode>_>_> *l_local;
  SchemeSpecialForm *this_local;
  
  local_28 = context;
  context_local = (Context *)l;
  l_local = (list<std::shared_ptr<ASTNode>,_std::allocator<std::shared_ptr<ASTNode>_>_> *)this;
  this_local = (SchemeSpecialForm *)__return_storage_ptr__;
  std::__cxx11::list<std::shared_ptr<ASTNode>,_std::allocator<std::shared_ptr<ASTNode>_>_>::
  pop_front(l);
  Registry<std::function<ExecutionResult_(const_std::__cxx11::list<std::shared_ptr<ASTNode>,_std::allocator<std::shared_ptr<ASTNode>_>_>_&,_const_Context_&)>_>
  ::get(&local_48,&this->name);
  std::
  function<ExecutionResult_(const_std::__cxx11::list<std::shared_ptr<ASTNode>,_std::allocator<std::shared_ptr<ASTNode>_>_>_&,_const_Context_&)>
  ::operator()(__return_storage_ptr__,&local_48,l,local_28);
  std::
  function<ExecutionResult_(const_std::__cxx11::list<std::shared_ptr<ASTNode>,_std::allocator<std::shared_ptr<ASTNode>_>_>_&,_const_Context_&)>
  ::~function(&local_48);
  return __return_storage_ptr__;
}

Assistant:

ExecutionResult SchemeSpecialForm::execute(std::list<std::shared_ptr<ASTNode>> l, const Context &context)
{
    l.pop_front();
    return SpecialFormRegistry::get(name)(l, context);
}